

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger default_delegate_tointeger(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  bool bVar2;
  SQInteger SVar3;
  SQRESULT SVar4;
  HSQUIRRELVM in_RDI;
  SQObjectPtr res;
  SQInteger base;
  SQObjectPtr *o;
  SQChar *in_stack_ffffffffffffff38;
  HSQUIRRELVM in_stack_ffffffffffffff40;
  SQObjectPtr *in_stack_ffffffffffffff48;
  SQObjectPtr *this;
  SQVM *in_stack_ffffffffffffff50;
  SQVM *this_00;
  HSQUIRRELVM in_stack_ffffffffffffff58;
  SQChar *in_stack_ffffffffffffff60;
  SQChar *in_stack_ffffffffffffff68;
  SQObjectPtr local_78;
  undefined1 local_68 [56];
  int local_30;
  float local_28;
  size_type sStack_24;
  SQInteger local_20;
  SQObjectPtr *local_18;
  HSQUIRRELVM local_10;
  
  local_10 = in_RDI;
  local_18 = stack_get(in_stack_ffffffffffffff40,(SQInteger)in_stack_ffffffffffffff38);
  local_20 = 10;
  SVar3 = sq_gettop(local_10);
  if (1 < SVar3) {
    sq_getinteger(in_stack_ffffffffffffff58,(SQInteger)in_stack_ffffffffffffff50,
                  (SQInteger *)in_stack_ffffffffffffff48);
  }
  SVar1 = (local_18->super_SQObject)._type;
  if (SVar1 == OT_BOOL) {
    this = &local_78;
    SQObjectPtr::SQObjectPtr
              (this,(ulong)((local_18->super_SQObject)._unVal.pTable != (SQTable *)0x0));
    SQVM::Push(in_stack_ffffffffffffff50,this);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_10);
  }
  else if ((SVar1 == OT_INTEGER) || (SVar1 == OT_FLOAT)) {
    if ((local_18->super_SQObject)._type == OT_FLOAT) {
      SVar3 = (SQInteger)(local_18->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar3 = (local_18->super_SQObject)._unVal.nInteger;
    }
    this_00 = (SQVM *)local_68;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00,SVar3);
    SQVM::Push(this_00,in_stack_ffffffffffffff48);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
  }
  else if (SVar1 == OT_STRING) {
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
    bVar2 = sq_parse_int(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         (SQObjectPtr *)in_stack_ffffffffffffff58,
                         (SQInteger)in_stack_ffffffffffffff50);
    if (bVar2) {
      if (local_30 == 0x5000004) {
        SVar3 = (SQInteger)local_28;
      }
      else {
        SVar3 = CONCAT44(sStack_24,local_28);
      }
      SQObjectPtr::SQObjectPtr((SQObjectPtr *)(local_68 + 0x18),SVar3);
      SQVM::Push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
      local_68._20_4_ = 2;
    }
    else {
      local_68._20_4_ = 0;
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
    if (local_68._20_4_ == 0) {
      SVar4 = sq_throwerror(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      return SVar4;
    }
  }
  else {
    SQVM::PushNull(in_stack_ffffffffffffff40);
  }
  return 1;
}

Assistant:

static SQInteger default_delegate_tointeger(HSQUIRRELVM v)
{
    SQObjectPtr &o=stack_get(v,1);
    SQInteger base = 10;
    if(sq_gettop(v) > 1) {
        sq_getinteger(v,2,&base);
    }
    switch(sq_type(o)){
    case OT_STRING:{
        SQObjectPtr res;
        if(sq_parse_int(_stringval(o), _stringval(o) + _string(o)->_len, res, base)){
            v->Push(SQObjectPtr(tointeger(res)));
            break;
        }}
        return sq_throwerror(v, _SC("cannot convert the string"));
        break;
    case OT_INTEGER:case OT_FLOAT:
        v->Push(SQObjectPtr(tointeger(o)));
        break;
    case OT_BOOL:
        v->Push(SQObjectPtr(_integer(o)?(SQInteger)1:(SQInteger)0));
        break;
    default:
        v->PushNull();
        break;
    }
    return 1;
}